

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O0

float NULLCMath::normalize2(float4 *v)

{
  float fVar1;
  float invLen;
  float len;
  float4 *v_local;
  
  fVar1 = length2(v);
  v->x = (1.0 / fVar1) * v->x;
  v->y = (1.0 / fVar1) * v->y;
  return fVar1;
}

Assistant:

float normalize2(float4* v)
	{
		float len = length2(v), invLen = 1.0f / len;
		v->x *= invLen;
		v->y *= invLen;
		return len;
	}